

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O1

void Curl_updateconninfo(Curl_easy *data,connectdata *conn,curl_socket_t sockfd)

{
  char *pcVar1;
  uint uVar2;
  Curl_handler *pCVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int local_port;
  char local_ip [46];
  int local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined6 uStack_40;
  undefined2 local_3a;
  undefined6 uStack_38;
  undefined8 uStack_32;
  
  uStack_38 = 0;
  uStack_32 = 0;
  uStack_48 = 0;
  uStack_40 = 0;
  local_3a = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_5c = -1;
  uVar2 = *(uint *)&(conn->bits).field_0x4;
  if ((-1 < (char)uVar2) && (((uVar2 >> 0x19 & 1) == 0 || (conn->transport != '\x03')))) {
    Curl_conninfo_remote(data,conn,sockfd);
  }
  Curl_conninfo_local(data,sockfd,(char *)&local_58,&local_5c);
  uVar4 = *(undefined8 *)conn->primary_ip;
  uVar5 = *(undefined8 *)(conn->primary_ip + 8);
  uVar6 = *(undefined8 *)(conn->primary_ip + 0x10);
  uVar7 = *(undefined8 *)(conn->primary_ip + 0x18);
  uVar8 = *(undefined8 *)(conn->primary_ip + 0x26);
  *(undefined8 *)((data->info).conn_primary_ip + 0x1e) = *(undefined8 *)(conn->primary_ip + 0x1e);
  *(undefined8 *)((data->info).conn_primary_ip + 0x26) = uVar8;
  *(undefined8 *)((data->info).conn_primary_ip + 0x10) = uVar6;
  *(undefined8 *)((data->info).conn_primary_ip + 0x18) = uVar7;
  *(undefined8 *)(data->info).conn_primary_ip = uVar4;
  *(undefined8 *)((data->info).conn_primary_ip + 8) = uVar5;
  pcVar1 = (data->info).conn_local_ip;
  if ((char)local_58 == '\0') {
    *pcVar1 = '\0';
  }
  else {
    *(ulong *)((data->info).conn_local_ip + 0x1e) = CONCAT62(uStack_38,local_3a);
    *(undefined8 *)((data->info).conn_local_ip + 0x26) = uStack_32;
    *(undefined8 *)((data->info).conn_local_ip + 0x10) = uStack_48;
    *(ulong *)((data->info).conn_local_ip + 0x18) = CONCAT26(local_3a,uStack_40);
    *(undefined8 *)pcVar1 = local_58;
    *(undefined8 *)((data->info).conn_local_ip + 8) = uStack_50;
  }
  pCVar3 = conn->handler;
  (data->info).conn_scheme = pCVar3->scheme;
  (data->info).conn_protocol = pCVar3->protocol & 0x3ffffff;
  (data->info).conn_primary_port = conn->port;
  (data->info).conn_remote_port = conn->remote_port;
  (data->info).conn_local_port = local_5c;
  return;
}

Assistant:

void Curl_updateconninfo(struct Curl_easy *data, struct connectdata *conn,
                         curl_socket_t sockfd)
{
  /* 'local_ip' and 'local_port' get filled with local's numerical
     ip address and port number whenever an outgoing connection is
     **established** from the primary socket to a remote address. */
  char local_ip[MAX_IPADR_LEN] = "";
  int local_port = -1;

  if(!conn->bits.reuse &&
     (conn->transport != TRNSPRT_TCP || !conn->bits.tcp_fastopen))
    Curl_conninfo_remote(data, conn, sockfd);
  Curl_conninfo_local(data, sockfd, local_ip, &local_port);

  /* persist connection info in session handle */
  Curl_persistconninfo(data, conn, local_ip, local_port);
}